

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

duckdb_state
duckdb_bind_varchar_length
          (duckdb_prepared_statement prepared_statement,idx_t param_idx,char *val,idx_t length)

{
  duckdb_state dVar1;
  Value value;
  string local_78;
  Value local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,val,val + length);
  duckdb::Value::Value(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  dVar1 = duckdb_bind_value(prepared_statement,param_idx,(duckdb_value)&local_58);
  duckdb::Value::~Value(&local_58);
  return dVar1;
}

Assistant:

duckdb_state duckdb_bind_varchar_length(duckdb_prepared_statement prepared_statement, idx_t param_idx, const char *val,
                                        idx_t length) {
	try {
		auto value = Value(std::string(val, length));
		return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&value);
	} catch (...) {
		return DuckDBError;
	}
}